

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_3,_2> *
tcu::operator*(Matrix<float,_3,_2> *__return_storage_ptr__,Matrix<float,_3,_2> *a,
              Matrix<float,_2,_2> *b)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_34;
  undefined4 local_30;
  int ndx;
  float v;
  int col;
  int row;
  Matrix<float,_2,_2> *b_local;
  Matrix<float,_3,_2> *a_local;
  Matrix<float,_3,_2> *res;
  
  Matrix<float,_3,_2>::Matrix(__return_storage_ptr__);
  for (v = 0.0; (int)v < 3; v = (float)((int)v + 1)) {
    for (ndx = 0; ndx < 2; ndx = ndx + 1) {
      local_30 = 0.0;
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        pfVar2 = Matrix<float,_3,_2>::operator()(a,(int)v,local_34);
        fVar1 = *pfVar2;
        pfVar2 = Matrix<float,_2,_2>::operator()(b,local_34,ndx);
        local_30 = fVar1 * *pfVar2 + local_30;
      }
      pfVar2 = Matrix<float,_3,_2>::operator()(__return_storage_ptr__,(int)v,ndx);
      *pfVar2 = local_30;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}